

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_lev.c
# Opt level: O0

void spill_terrain(level *lev,spill *sp,mkroom *croom)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int local_38;
  int iStack_34;
  boolean found;
  int guard;
  int lastdir;
  int k;
  int j;
  schar qy;
  schar qx;
  schar ny;
  schar nx;
  schar y;
  mkroom *pmStack_20;
  schar x;
  mkroom *croom_local;
  spill *sp_local;
  level *lev_local;
  
  bVar1 = false;
  if (sp->typ < '\'') {
    pmStack_20 = croom;
    croom_local = (mkroom *)sp;
    sp_local = (spill *)lev;
    if ((sp->x < '\0') || (sp->y < '\0')) {
      for (lastdir = 0; lastdir < 500; lastdir = lastdir + 1) {
        j._3_1_ = croom_local->lx;
        j._2_1_ = croom_local->hx;
        get_location((level *)sp_local,(schar *)((long)&j + 3),(schar *)((long)&j + 2),3,pmStack_20)
        ;
        j._1_1_ = j._3_1_;
        j._0_1_ = j._2_1_;
        switch(croom_local->ly) {
        case '\x01':
          j._0_1_ = j._2_1_ + '\x01';
          break;
        case '\x02':
          j._0_1_ = j._2_1_ + -1;
          break;
        default:
          return;
        case '\x04':
          j._1_1_ = j._3_1_ + -1;
          break;
        case '\b':
          j._1_1_ = j._3_1_ + '\x01';
        }
        if ((((('\0' < j._1_1_) && (j._1_1_ < 'P')) && (-1 < (char)j)) &&
            (((char)j < '\x15' &&
             (sp_local[(long)j._1_1_ * 0x2a + (long)(char)j * 2 + 0xb].direction != '\0')))) &&
           (sp_local[(long)j._1_1_ * 0x2a + (long)(char)j * 2 + 0xb].direction < '\r')) {
          if (croom_local->rlit < '\'') {
            sp_local[(long)j._1_1_ * 0x2a + (long)(char)j * 2 + 0xb].direction = croom_local->rlit;
          }
          if (croom_local->rlit == '\x15') {
            *(uint *)&sp_local[(long)j._1_1_ * 0x2a + (long)(char)j * 2 + 0xb].lit =
                 *(uint *)&sp_local[(long)j._1_1_ * 0x2a + (long)(char)j * 2 + 0xb].lit & 0xfffffbff
                 | 0x400;
          }
          else if (croom_local->rtype != -2) {
            if (croom_local->rtype == -1) {
              uVar2 = rn2(2);
              *(uint *)&sp_local[(long)j._1_1_ * 0x2a + (long)(char)j * 2 + 0xb].lit =
                   *(uint *)&sp_local[(long)j._1_1_ * 0x2a + (long)(char)j * 2 + 0xb].lit &
                   0xfffffbff | (uVar2 & 1) << 10;
            }
            else {
              *(uint *)&sp_local[(long)j._1_1_ * 0x2a + (long)(char)j * 2 + 0xb].lit =
                   *(uint *)&sp_local[(long)j._1_1_ * 0x2a + (long)(char)j * 2 + 0xb].lit &
                   0xfffffbff | ((int)croom_local->rtype & 1U) << 10;
            }
          }
          bVar1 = true;
          break;
        }
      }
    }
    else {
      bVar1 = true;
      j._3_1_ = sp->x;
      j._2_1_ = sp->y;
      get_location(lev,(schar *)((long)&j + 3),(schar *)((long)&j + 2),3,croom);
    }
    if (bVar1) {
      iStack_34 = -1;
      j._1_1_ = j._3_1_;
      j._0_1_ = j._2_1_;
      for (lastdir = (int)croom_local->hy; 0 < lastdir; lastdir = lastdir + -1) {
        local_38 = 0;
        if (croom_local->rlit < '\'') {
          sp_local[(long)j._1_1_ * 0x2a + (long)(char)j * 2 + 0xb].direction = croom_local->rlit;
        }
        if (croom_local->rlit == '\x15') {
          *(uint *)&sp_local[(long)j._1_1_ * 0x2a + (long)(char)j * 2 + 0xb].lit =
               *(uint *)&sp_local[(long)j._1_1_ * 0x2a + (long)(char)j * 2 + 0xb].lit & 0xfffffbff |
               0x400;
        }
        else if (croom_local->rtype != -2) {
          if (croom_local->rtype == -1) {
            uVar2 = rn2(2);
            *(uint *)&sp_local[(long)j._1_1_ * 0x2a + (long)(char)j * 2 + 0xb].lit =
                 *(uint *)&sp_local[(long)j._1_1_ * 0x2a + (long)(char)j * 2 + 0xb].lit & 0xfffffbff
                 | (uVar2 & 1) << 10;
          }
          else {
            *(uint *)&sp_local[(long)j._1_1_ * 0x2a + (long)(char)j * 2 + 0xb].lit =
                 *(uint *)&sp_local[(long)j._1_1_ * 0x2a + (long)(char)j * 2 + 0xb].lit & 0xfffffbff
                 | ((int)croom_local->rtype & 1U) << 10;
          }
        }
        do {
          local_38 = local_38 + 1;
          do {
            iVar3 = rn2(5);
            if (iVar3 < 4) {
              guard = 1 << ((byte)iVar3 & 0x1f);
            }
            else {
              guard = (int)croom_local->ly;
            }
            if (guard - 1U < 7 || guard == 8) {
              (*(code *)(&DAT_0038fa04 + *(int *)(&DAT_0038fa04 + (ulong)(guard - 1U) * 4)))();
              return;
            }
            bVar1 = false;
            if ((('\0' < j._1_1_) && (bVar1 = false, j._1_1_ < 'P')) &&
               (bVar1 = false, -1 < (char)j)) {
              bVar1 = (char)j < '\x15';
            }
          } while (!bVar1);
          if ((guard == iStack_34) ||
             (bVar1 = false,
             sp_local[(long)j._1_1_ * 0x2a + (long)(char)j * 2 + 0xb].direction == croom_local->rlit
             )) {
            bVar1 = local_38 < 200;
          }
        } while (bVar1);
        switch(guard) {
        case 1:
          j._0_1_ = (char)j + -1;
          break;
        case 2:
          j._0_1_ = (char)j + '\x01';
          break;
        case 4:
          j._1_1_ = j._1_1_ + '\x01';
          break;
        case 8:
          j._1_1_ = j._1_1_ + -1;
        }
        iStack_34 = guard;
      }
    }
  }
  return;
}

Assistant:

static void spill_terrain(struct level *lev, spill *sp, struct mkroom *croom)
{
	schar x, y, nx, ny, qx, qy;
	int j, k, lastdir, guard;
	boolean found = FALSE;

	if (sp->typ >= MAX_TYPE) return;

	/* This code assumes that you're going to spill one particular
	 * type of terrain from a wall into somewhere.
	 *
	 * If we were given a specific coordinate, though, it doesn't have
	 * to start from a wall... */
	if (sp->x < 0 || sp->y < 0) {
	    for (j = 0; j < 500; j++) {
		x = sp->x;
		y = sp->y;
		get_location(lev, &x, &y, DRY|WET, croom);
		nx = x;
		ny = y;
		switch (sp->direction) {
		/* backwards to make sure we're against a wall */
		case W_NORTH: ny++; break;
		case W_SOUTH: ny--; break;
		case W_WEST: nx++; break;
		case W_EAST: nx--; break;
		default: return; break;
		}
		if (!isok(nx, ny)) continue;
		if (IS_WALL(lev->locations[nx][ny].typ)) {
		    /* mark it as broken through */
		    SET_TYPLIT(lev, nx, ny, sp->typ, sp->lit);
		    found = TRUE;
		    break;
		}
	    }
	} else {
	    found = TRUE;
	    x = sp->x;
	    y = sp->y;
	    /* support random registers too */
	    get_location(lev, &x, &y, DRY|WET, croom);
	}

	if (!found) return;

	/* gloop! */
	lastdir = -1;
	nx = x;
	ny = y;
	for (j = sp->count; j > 0; j--) {
	    guard = 0;
	    SET_TYPLIT(lev, nx, ny, sp->typ, sp->lit);
	    do {
		guard++;
		do {
		    k = rn2(5);
		    qx = nx;  qy = ny;
		    if (k > 3)
			k = sp->direction;
		    else
			k = 1 << k;
		    switch(k) {
		    case W_NORTH: qy--; break;
		    case W_SOUTH: qy++; break;
		    case W_WEST: qx--; break;
		    case W_EAST: qx++; break;
		    }
		} while (!isok(qx,qy));
	    } while ((k == lastdir || lev->locations[qx][qy].typ == sp->typ) &&
		     guard < 200);
	    /* tend to not make rivers, but pools;
	     * and don't redo stuff of the same type! */

	    switch(k) {
	    case W_NORTH: ny--; break;
	    case W_SOUTH: ny++; break;
	    case W_WEST: nx--; break;
	    case W_EAST: nx++; break;
	    }
	    lastdir = k;
	}
}